

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::CSVBuffer::CSVBuffer
          (CSVBuffer *this,CSVFileHandle *file_handle,ClientContext *context,idx_t buffer_size,
          idx_t global_csv_current_position,idx_t buffer_idx_p)

{
  BufferHandle *this_00;
  data_ptr_t pdVar1;
  data_ptr_t buffer;
  ulong uVar2;
  idx_t iVar3;
  
  this->last_buffer = false;
  this->context = context;
  this->requested_size = buffer_size;
  this->global_csv_start = global_csv_current_position;
  this->can_seek = file_handle->can_seek;
  this->is_pipe = file_handle->is_pipe;
  this->buffer_idx = buffer_idx_p;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  AllocateBuffer(this,buffer_size);
  pdVar1 = BufferHandle::Ptr(this_00);
  buffer = BufferHandle::Ptr(this_00);
  uVar2 = CSVFileHandle::Read(file_handle,buffer,buffer_size);
  while( true ) {
    this->actual_buffer_size = uVar2;
    if ((buffer_size < uVar2 || buffer_size - uVar2 == 0) || ((file_handle->finished & 1U) != 0))
    break;
    iVar3 = CSVFileHandle::Read(file_handle,pdVar1 + uVar2,buffer_size - uVar2);
    uVar2 = iVar3 + this->actual_buffer_size;
  }
  this->last_buffer = file_handle->finished;
  return;
}

Assistant:

CSVBuffer::CSVBuffer(CSVFileHandle &file_handle, ClientContext &context, idx_t buffer_size,
                     idx_t global_csv_current_position, idx_t buffer_idx_p)
    : context(context), requested_size(buffer_size), global_csv_start(global_csv_current_position),
      can_seek(file_handle.CanSeek()), is_pipe(file_handle.IsPipe()), buffer_idx(buffer_idx_p) {
	AllocateBuffer(buffer_size);
	auto buffer = handle.Ptr();
	actual_buffer_size = file_handle.Read(handle.Ptr(), buffer_size);
	while (actual_buffer_size < buffer_size && !file_handle.FinishedReading()) {
		// We keep reading until this block is full
		actual_buffer_size += file_handle.Read(&buffer[actual_buffer_size], buffer_size - actual_buffer_size);
	}
	last_buffer = file_handle.FinishedReading();
}